

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

bool __thiscall
cmFileInstaller::Parse
          (cmFileInstaller *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmExecutionStatus *pcVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
  __l;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  pointer ppVar7;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool local_379;
  undefined1 local_290 [8];
  string e;
  key_type local_268;
  _Self local_258;
  const_iterator it;
  undefined1 local_220 [8];
  string install_mode;
  string_view local_1f8;
  cmInstallMode local_1e4;
  string_view local_1e0;
  cmInstallMode local_1cc;
  string_view local_1c8;
  cmInstallMode local_1b4;
  string_view local_1b0;
  cmInstallMode local_19c;
  string_view local_198;
  cmInstallMode local_184;
  string_view local_180;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_170;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_158;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_140;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_128;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_110;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode> local_f8;
  iterator local_e0;
  size_type local_d8;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileInstaller *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = cmFileCopier::Parse(&this->super_cmFileCopier,args);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00971047;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "INSTALL option RENAME may not be combined with FILES_FROM_DIR.",&local_41);
      cmExecutionStatus::SetError(pcVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      this_local._7_1_ = 0;
      goto LAB_00971047;
    }
    if ((*(int *)&(this->super_cmFileCopier).field_0xf4 != 4) &&
       (*(int *)&(this->super_cmFileCopier).field_0xf4 != 5)) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "INSTALL option RENAME may be used only with FILES or PROGRAMS.",&local_79);
      cmExecutionStatus::SetError(pcVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      this_local._7_1_ = 0;
      goto LAB_00971047;
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_cmFileCopier).Files);
    if (1 < sVar6) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"INSTALL option RENAME may be used only with one file.",
                 &local_a1);
      cmExecutionStatus::SetError(pcVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      this_local._7_1_ = 0;
      goto LAB_00971047;
    }
  }
  bVar2 = HandleInstallDestination(this);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00971047;
  }
  if (1 < (byte)(((this->MessageAlways & 1U) != 0) + ((this->MessageLazy & 1U) != 0) +
                ((this->MessageNever & 1U) != 0))) {
    pcVar1 = (this->super_cmFileCopier).Status;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "INSTALL options MESSAGE_ALWAYS, MESSAGE_LAZY, and MESSAGE_NEVER are mutually exclusive."
               ,&local_c9);
    cmExecutionStatus::SetError(pcVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    this_local._7_1_ = 0;
    goto LAB_00971047;
  }
  if (Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
      install_mode_dict == '\0') {
    iVar4 = __cxa_guard_acquire(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::install_mode_dict);
    if (iVar4 != 0) {
      local_180 = (string_view)::cm::operator____s("ABS_SYMLINK",0xb);
      local_184 = ABS_SYMLINK;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_170,(static_string_view *)&local_180,&local_184);
      local_198 = (string_view)::cm::operator____s("ABS_SYMLINK_OR_COPY",0x13);
      local_19c = ABS_SYMLINK_OR_COPY;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_158,(static_string_view *)&local_198,&local_19c);
      local_1b0 = (string_view)::cm::operator____s("REL_SYMLINK",0xb);
      local_1b4 = REL_SYMLINK;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_140,(static_string_view *)&local_1b0,&local_1b4);
      local_1c8 = (string_view)::cm::operator____s("REL_SYMLINK_OR_COPY",0x13);
      local_1cc = REL_SYMLINK_OR_COPY;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_128,(static_string_view *)&local_1c8,&local_1cc);
      local_1e0 = (string_view)::cm::operator____s("SYMLINK",7);
      local_1e4 = SYMLINK;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_110,(static_string_view *)&local_1e0,&local_1e4);
      local_1f8 = (string_view)::cm::operator____s("SYMLINK_OR_COPY",0xf);
      install_mode.field_2._12_4_ = 6;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>::
      pair<cm::static_string_view,_cmInstallMode,_true>
                (&local_f8,(static_string_view *)&local_1f8,
                 (cmInstallMode *)(install_mode.field_2._M_local_buf + 0xc));
      local_e0 = &local_170;
      local_d8 = 6;
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
      ::allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
                   *)(install_mode.field_2._M_local_buf + 10));
      __l._M_len = local_d8;
      __l._M_array = local_e0;
      std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
      ::map(&Parse::install_mode_dict,__l,
            (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)
            (install_mode.field_2._M_local_buf + 0xb),
            (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
             *)(install_mode.field_2._M_local_buf + 10));
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
      ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
                    *)(install_mode.field_2._M_local_buf + 10));
      __cxa_atexit(std::
                   map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
                   ::~map,&Parse::install_mode_dict,&__dso_handle);
      __cxa_guard_release(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::install_mode_dict);
    }
  }
  std::__cxx11::string::string((string *)local_220);
  cmsys::SystemTools::GetEnv("CMAKE_INSTALL_MODE",(string *)local_220);
  bVar3 = std::__cxx11::string::empty();
  local_379 = true;
  if ((bVar3 & 1) == 0) {
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_220);
    __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("COPY",4);
    it._M_node = (_Base_ptr)__y._M_len;
    local_379 = std::operator==(__x,__y);
  }
  if (local_379 == false) {
    local_268 = (key_type)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_220);
    local_258._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
         ::find(&Parse::install_mode_dict,&local_268);
    e.field_2._8_8_ =
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
         ::end(&Parse::install_mode_dict);
    bVar2 = std::operator!=(&local_258,(_Self *)((long)&e.field_2 + 8));
    if (bVar2) {
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
               ::operator->(&local_258);
      this->InstallMode = ppVar7->second;
      goto LAB_0097101d;
    }
    cmStrCat<char_const(&)[21],std::__cxx11::string&,char_const(&)[46]>
              ((string *)local_290,(char (*) [21])"Unrecognized value \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
               (char (*) [46])"\' for environment variable CMAKE_INSTALL_MODE");
    cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_290);
    this_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_290);
  }
  else {
    this->InstallMode = COPY;
LAB_0097101d:
    this_local._7_1_ = 1;
  }
  std::__cxx11::string::~string((string *)local_220);
LAB_00971047:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileInstaller::Parse(std::vector<std::string> const& args)
{
  if (!this->cmFileCopier::Parse(args)) {
    return false;
  }

  if (!this->Rename.empty()) {
    if (!this->FilesFromDir.empty()) {
      this->Status.SetError("INSTALL option RENAME may not be "
                            "combined with FILES_FROM_DIR.");
      return false;
    }
    if (this->InstallType != cmInstallType_FILES &&
        this->InstallType != cmInstallType_PROGRAMS) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with FILES or PROGRAMS.");
      return false;
    }
    if (this->Files.size() > 1) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with one file.");
      return false;
    }
  }

  if (!this->HandleInstallDestination()) {
    return false;
  }

  if (((this->MessageAlways ? 1 : 0) + (this->MessageLazy ? 1 : 0) +
       (this->MessageNever ? 1 : 0)) > 1) {
    this->Status.SetError("INSTALL options MESSAGE_ALWAYS, "
                          "MESSAGE_LAZY, and MESSAGE_NEVER "
                          "are mutually exclusive.");
    return false;
  }

  static const std::map<cm::string_view, cmInstallMode> install_mode_dict{
    { "ABS_SYMLINK"_s, cmInstallMode::ABS_SYMLINK },
    { "ABS_SYMLINK_OR_COPY"_s, cmInstallMode::ABS_SYMLINK_OR_COPY },
    { "REL_SYMLINK"_s, cmInstallMode::REL_SYMLINK },
    { "REL_SYMLINK_OR_COPY"_s, cmInstallMode::REL_SYMLINK_OR_COPY },
    { "SYMLINK"_s, cmInstallMode::SYMLINK },
    { "SYMLINK_OR_COPY"_s, cmInstallMode::SYMLINK_OR_COPY }
  };

  std::string install_mode;
  cmSystemTools::GetEnv("CMAKE_INSTALL_MODE", install_mode);
  if (install_mode.empty() || install_mode == "COPY"_s) {
    this->InstallMode = cmInstallMode::COPY;
  } else {
    auto it = install_mode_dict.find(install_mode);
    if (it != install_mode_dict.end()) {
      this->InstallMode = it->second;
    } else {
      auto e = cmStrCat("Unrecognized value '", install_mode,
                        "' for environment variable CMAKE_INSTALL_MODE");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}